

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseMetaData(Parser *this,SymbolTable<flatbuffers::Value> *attributes)

{
  bool bVar1;
  Value *this_00;
  SymbolTable<flatbuffers::Value> *in_RDX;
  bool local_fa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Value *local_b8;
  Value *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Self local_88;
  _Self local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string name;
  SymbolTable<flatbuffers::Value> *attributes_local;
  Parser *this_local;
  CheckedError *ce;
  
  bVar1 = Is((Parser *)attributes,0x28);
  if (bVar1) {
    Next(this);
    name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
    name.field_2._9_3_ = 0;
    if (!(bool)name.field_2._M_local_buf[8]) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (name.field_2._8_4_ != 0) goto LAB_00111253;
    do {
      std::__cxx11::string::string
                ((string *)local_58,
                 (string *)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = Is((Parser *)attributes,0x104);
      local_fa = true;
      if (!bVar1) {
        local_fa = Is((Parser *)attributes,0x101);
      }
      if (local_fa == false) {
        std::operator+(&local_78,"attribute name must be either identifier or string: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        Error(this,(string *)attributes);
        std::__cxx11::string::~string((string *)&local_78);
        name.field_2._8_4_ = 1;
      }
      else {
        local_80._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)&attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (key_type *)local_58);
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    *)&attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        bVar1 = std::operator==(&local_80,&local_88);
        if (bVar1) {
          std::operator+(&local_a8,"user define attributes must be declared before use: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58);
          Error(this,(string *)attributes);
          std::__cxx11::string::~string((string *)&local_a8);
          name.field_2._8_4_ = 1;
        }
        else {
          e._7_1_ = 0;
          Next(this);
          name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          if ((bool)name.field_2._M_local_buf[8]) {
            e._7_1_ = 1;
          }
          name.field_2._9_3_ = 0;
          if ((e._7_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (name.field_2._8_4_ == 0) {
            this_00 = (Value *)operator_new(0x48);
            Value::Value(this_00);
            local_b8 = this_00;
            bVar1 = SymbolTable<flatbuffers::Value>::Add(in_RDX,(string *)local_58,this_00);
            if (bVar1) {
              std::operator+(&local_d8,"attribute already found: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58);
              Warning((Parser *)attributes,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
            }
            bVar1 = Is((Parser *)attributes,0x3a);
            if (bVar1) {
              Next(this);
              name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
              name.field_2._9_3_ = 0;
              if (!(bool)name.field_2._M_local_buf[8]) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (name.field_2._8_4_ == 0) {
                ParseSingleValue(this,(string *)attributes,(Value *)local_58,SUB81(local_b8,0));
                name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                name.field_2._9_3_ = 0;
                if (!(bool)name.field_2._M_local_buf[8]) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (name.field_2._8_4_ == 0) goto LAB_001110bf;
              }
            }
            else {
LAB_001110bf:
              bVar1 = Is((Parser *)attributes,0x29);
              if (bVar1) {
                Next(this);
                name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                name.field_2._9_3_ = 0;
                if (!(bool)name.field_2._M_local_buf[8]) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (name.field_2._8_4_ == 0) {
                  name.field_2._8_4_ = 2;
                }
              }
              else {
                Expect(this,(int)attributes);
                name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                name.field_2._9_3_ = 0;
                if (!(bool)name.field_2._M_local_buf[8]) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (name.field_2._8_4_ == 0) {
                  name.field_2._8_4_ = 0;
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_58);
    } while (name.field_2._8_4_ == 0);
    if (name.field_2._8_4_ == 1) goto LAB_00111253;
  }
  anon_unknown_0::NoError();
LAB_00111253:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseMetaData(SymbolTable<Value> *attributes) {
  if (Is('(')) {
    NEXT();
    for (;;) {
      auto name = attribute_;
      if (false == (Is(kTokenIdentifier) || Is(kTokenStringConstant)))
        return Error("attribute name must be either identifier or string: " +
                     name);
      if (known_attributes_.find(name) == known_attributes_.end())
        return Error("user define attributes must be declared before use: " +
                     name);
      NEXT();
      auto e = new Value();
      if (attributes->Add(name, e)) Warning("attribute already found: " + name);
      if (Is(':')) {
        NEXT();
        ECHECK(ParseSingleValue(&name, *e, true));
      }
      if (Is(')')) {
        NEXT();
        break;
      }
      EXPECT(',');
    }
  }
  return NoError();
}